

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_heap_relax_snode.c
# Opt level: O0

void ilu_heap_relax_snode
               (int n,int *et,int relax_columns,int *descendants,int *relax_end,int *relax_fsupc)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  int *addr;
  int local_180;
  char local_178 [8];
  char msg [256];
  int *iwork;
  int *inv_post;
  int *post;
  int *et_save;
  int local_50;
  int snode_start;
  int parent;
  int f;
  int l;
  int k;
  int j;
  int i;
  int *relax_fsupc_local;
  int *relax_end_local;
  int *descendants_local;
  int relax_columns_local;
  int *et_local;
  int n_local;
  
  msg._248_8_ = intMalloc(n * 3 + 2);
  if ((int_t *)msg._248_8_ == (int_t *)0x0) {
    sprintf(local_178,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for iwork[]",0x3d,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/ilu_heap_relax_snode.c"
           );
    superlu_abort_and_exit(local_178);
  }
  lVar4 = msg._248_8_ + (long)n * 4 + 4;
  lVar5 = lVar4 + (long)n * 4 + 4;
  addr = TreePostorder(n,et);
  for (k = 0; k < n + 1; k = k + 1) {
    *(int *)(lVar4 + (long)addr[k] * 4) = k;
  }
  for (k = 0; k < n; k = k + 1) {
    *(int *)(msg._248_8_ + (long)addr[k] * 4) = addr[et[k]];
    *(int *)(lVar5 + (long)k * 4) = et[k];
  }
  for (k = 0; k < n; k = k + 1) {
    et[k] = *(int *)(msg._248_8_ + (long)k * 4);
  }
  ifill(relax_end,n,-1);
  ifill(relax_fsupc,n,-1);
  for (l = 0; l < n; l = l + 1) {
    descendants[l] = 0;
  }
  for (l = 0; l < n; l = l + 1) {
    iVar1 = et[l];
    if (iVar1 != n) {
      descendants[iVar1] = descendants[l] + 1 + descendants[iVar1];
    }
  }
  l = 0;
  snode_start = 0;
  while (iVar1 = l, l < n) {
    local_50 = et[l];
    while( true ) {
      bVar3 = false;
      if (local_50 != n) {
        bVar3 = descendants[local_50] < relax_columns;
      }
      if (!bVar3) break;
      l = local_50;
      local_50 = et[local_50];
    }
    f = n;
    for (k = iVar1; k <= l; k = k + 1) {
      if (f < *(int *)(lVar4 + (long)k * 4)) {
        local_180 = f;
      }
      else {
        local_180 = *(int *)(lVar4 + (long)k * 4);
      }
      f = local_180;
    }
    iVar2 = *(int *)(lVar4 + (long)l * 4);
    if (iVar2 - f == l - iVar1) {
      relax_end[f] = iVar2;
      relax_fsupc[snode_start] = f;
      snode_start = snode_start + 1;
    }
    else {
      for (k = iVar1; k <= l; k = k + 1) {
        iVar1 = *(int *)(lVar4 + (long)k * 4);
        if (descendants[k] == 0) {
          relax_end[iVar1] = iVar1;
          relax_fsupc[snode_start] = iVar1;
          snode_start = snode_start + 1;
        }
      }
    }
    do {
      l = l + 1;
    } while (descendants[l] != 0 && l < n);
  }
  for (k = 0; k < n; k = k + 1) {
    et[k] = *(int *)(lVar5 + (long)k * 4);
  }
  superlu_free(addr);
  superlu_free((void *)msg._248_8_);
  return;
}

Assistant:

void
ilu_heap_relax_snode (
	     const     int n,
	     int       *et,	      /* column elimination tree */
	     const int relax_columns, /* max no of columns allowed in a
					 relaxed snode */
	     int       *descendants,  /* no of descendants of each node
					 in the etree */
	     int       *relax_end,    /* last column in a supernode
				       * if j-th column starts a relaxed
				       * supernode, relax_end[j] represents
				       * the last column of this supernode */
	     int       *relax_fsupc   /* first column in a supernode
				       * relax_fsupc[j] represents the first
				       * column of j-th supernode */
	     )
{
    register int i, j, k, l, f, parent;
    register int snode_start;	/* beginning of a snode */
    int *et_save, *post, *inv_post, *iwork;
#if ( PRNTlevel>=1 )
    int nsuper_et = 0, nsuper_et_post = 0;
#endif

    /* The etree may not be postordered, but is heap ordered. */

    iwork = (int*) intMalloc(3*n+2);
    if ( !iwork ) ABORT("SUPERLU_MALLOC fails for iwork[]");
    inv_post = iwork + n+1;
    et_save = inv_post + n+1;

    /* Post order etree */
    post = (int *) TreePostorder(n, et);
    for (i = 0; i < n+1; ++i) inv_post[post[i]] = i;

    /* Renumber etree in postorder */
    for (i = 0; i < n; ++i) {
	iwork[post[i]] = post[et[i]];
	et_save[i] = et[i]; /* Save the original etree */
    }
    for (i = 0; i < n; ++i) et[i] = iwork[i];

    /* Compute the number of descendants of each node in the etree */
    ifill (relax_end, n, SLU_EMPTY);
    ifill (relax_fsupc, n, SLU_EMPTY);
    for (j = 0; j < n; j++) descendants[j] = 0;
    for (j = 0; j < n; j++) {
	parent = et[j];
	if ( parent != n )  /* not the dummy root */
	    descendants[parent] += descendants[j] + 1;
    }

    /* Identify the relaxed supernodes by postorder traversal of the etree. */
    for ( f = j = 0; j < n; ) {
	parent = et[j];
	snode_start = j;
	while ( parent != n && descendants[parent] < relax_columns ) {
	    j = parent;
	    parent = et[j];
	}
	/* Found a supernode in postordered etree; j is the last column. */
#if ( PRNTlevel>=1 )
	++nsuper_et_post;
#endif
	k = n;
	for (i = snode_start; i <= j; ++i)
	    k = SUPERLU_MIN(k, inv_post[i]);
	l = inv_post[j];
	if ( (l - k) == (j - snode_start) ) {
	    /* It's also a supernode in the original etree */
	    relax_end[k] = l;		/* Last column is recorded */
	    relax_fsupc[f++] = k;
#if ( PRNTlevel>=1 )
	    ++nsuper_et;
#endif
	} else {
	    for (i = snode_start; i <= j; ++i) {
		l = inv_post[i];
		if ( descendants[i] == 0 ) {
		    relax_end[l] = l;
		    relax_fsupc[f++] = l;
#if ( PRNTlevel>=1 )
		    ++nsuper_et;
#endif
		}
	    }
	}
	j++;
	/* Search for a new leaf */
	while ( descendants[j] != 0 && j < n ) j++;
    }

#if ( PRNTlevel>=1 )
    printf(".. heap_snode_relax:\n"
	   "\tNo of relaxed snodes in postordered etree:\t%d\n"
	   "\tNo of relaxed snodes in original etree:\t%d\n",
	   nsuper_et_post, nsuper_et);
#endif

    /* Recover the original etree */
    for (i = 0; i < n; ++i) et[i] = et_save[i];

    SUPERLU_FREE(post);
    SUPERLU_FREE(iwork);
}